

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

CharSetNode * __thiscall
UnifiedRegex::CharSetInner::Set
          (CharSetInner *this,ArenaAllocator *allocator,uint level,uint l,uint h)

{
  code *pcVar1;
  bool bVar2;
  uint level_00;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  CharSetNode *pCVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  uint local_40;
  uint local_3c;
  uint i_1;
  uint i;
  bool couldBeFull;
  uint hi;
  uint li;
  uint h_local;
  uint l_local;
  uint level_local;
  ArenaAllocator *allocator_local;
  CharSetInner *this_local;
  
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x1b1,"(level > 0)","level > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  local_3c = CharSetNode::innerIdx(level,l);
  level_00 = level - 1;
  uVar3 = CharSetNode::innerIdx(level,h);
  i_1._3_1_ = true;
  if (local_3c == uVar3) {
    if (this->children[local_3c] == (CharSetNode *)0x0) {
      uVar3 = CharSetNode::remain(level_00,l);
      if ((uVar3 == 0) && (uVar3 = CharSetNode::remain(level_00,h + 1), uVar3 == 0)) {
        this->children[local_3c] = (CharSetNode *)&CharSetFull::Instance;
      }
      else {
        pCVar8 = CharSetNode::For(allocator,level_00);
        this->children[local_3c] = pCVar8;
        iVar4 = (*this->children[local_3c]->_vptr_CharSetNode[2])
                          (this->children[local_3c],allocator,(ulong)level_00,(ulong)l,(ulong)h);
        this->children[local_3c] = (CharSetNode *)CONCAT44(extraout_var,iVar4);
        i_1._3_1_ = false;
      }
    }
    else {
      iVar4 = (*this->children[local_3c]->_vptr_CharSetNode[2])
                        (this->children[local_3c],allocator,(ulong)level_00,(ulong)l,(ulong)h);
      this->children[local_3c] = (CharSetNode *)CONCAT44(extraout_var_00,iVar4);
    }
  }
  else {
    if (this->children[local_3c] == (CharSetNode *)0x0) {
      uVar5 = CharSetNode::remain(level_00,l);
      if (uVar5 != 0) {
        pCVar8 = CharSetNode::For(allocator,level_00);
        this->children[local_3c] = pCVar8;
        pCVar8 = this->children[local_3c];
        uVar6 = CharSetNode::lim(level_00);
        iVar4 = (*pCVar8->_vptr_CharSetNode[2])
                          (pCVar8,allocator,(ulong)level_00,(ulong)l,(ulong)uVar6);
        this->children[local_3c] = (CharSetNode *)CONCAT44(extraout_var_01,iVar4);
      }
      else {
        this->children[local_3c] = (CharSetNode *)&CharSetFull::Instance;
      }
      i_1._3_1_ = uVar5 == 0;
    }
    else {
      pCVar8 = this->children[local_3c];
      uVar5 = CharSetNode::lim(level_00);
      iVar4 = (*pCVar8->_vptr_CharSetNode[2])
                        (pCVar8,allocator,(ulong)level_00,(ulong)l,(ulong)uVar5);
      this->children[local_3c] = (CharSetNode *)CONCAT44(extraout_var_02,iVar4);
    }
    while (local_3c = local_3c + 1, local_3c < uVar3) {
      if (this->children[local_3c] != (CharSetNode *)0x0) {
        (**this->children[local_3c]->_vptr_CharSetNode)(this->children[local_3c],allocator);
      }
      this->children[local_3c] = (CharSetNode *)&CharSetFull::Instance;
    }
    if (this->children[uVar3] == (CharSetNode *)0x0) {
      uVar5 = CharSetNode::remain(level_00,h + 1);
      if (uVar5 == 0) {
        this->children[uVar3] = (CharSetNode *)&CharSetFull::Instance;
      }
      else {
        pCVar8 = CharSetNode::For(allocator,level_00);
        this->children[uVar3] = pCVar8;
        iVar4 = (*this->children[uVar3]->_vptr_CharSetNode[2])
                          (this->children[uVar3],allocator,(ulong)level_00,0,(ulong)h);
        this->children[uVar3] = (CharSetNode *)CONCAT44(extraout_var_03,iVar4);
        i_1._3_1_ = false;
      }
    }
    else {
      iVar4 = (*this->children[uVar3]->_vptr_CharSetNode[2])
                        (this->children[uVar3],allocator,(ulong)level_00,0,(ulong)h);
      this->children[uVar3] = (CharSetNode *)CONCAT44(extraout_var_04,iVar4);
    }
  }
  this_local = this;
  if (i_1._3_1_) {
    for (local_40 = 0; local_40 < 0x10; local_40 = local_40 + 1) {
      if (this->children[local_40] != (CharSetNode *)&CharSetFull::Instance) {
        return &this->super_CharSetNode;
      }
    }
    FreeSelf(this,allocator);
    this_local = (CharSetInner *)&CharSetFull::Instance;
  }
  return &this_local->super_CharSetNode;
}

Assistant:

CharSetNode* CharSetInner::Set(ArenaAllocator* allocator, uint level, uint l, uint h)
    {
        Assert(level > 0);
        uint li = innerIdx(level, l);
        uint hi = innerIdx(level--, h);
        bool couldBeFull = true;
        if (li == hi)
        {
            if (children[li] == nullptr)
            {
                if (remain(level, l) == 0 && remain(level, h + 1) == 0)
                    children[li] = CharSetFull::TheFullNode;
                else
                {
                    children[li] = For(allocator, level);
                    children[li] = children[li]->Set(allocator, level, l, h);
                    couldBeFull = false;
                }
            }
            else
                children[li] = children[li]->Set(allocator, level, l, h);
        }
        else
        {
            if (children[li] == nullptr)
            {
                if (remain(level, l) == 0)
                    children[li] = CharSetFull::TheFullNode;
                else
                {
                    children[li] = For(allocator, level);
                    children[li] = children[li]->Set(allocator, level, l, lim(level));
                    couldBeFull = false;
                }
            }
            else
                children[li] = children[li]->Set(allocator, level, l, lim(level));
            for (uint i = li + 1; i < hi; i++)
            {
                if (children[i] != nullptr)
                    children[i]->FreeSelf(allocator);
                children[i] = CharSetFull::TheFullNode;
            }
            if (children[hi] == nullptr)
            {
                if (remain(level, h + 1) == 0)
                    children[hi] = CharSetFull::TheFullNode;
                else
                {
                    children[hi] = For(allocator, level);
                    children[hi] = children[hi]->Set(allocator, level, 0, h);
                    couldBeFull = false;
                }
            }
            else
                children[hi] = children[hi]->Set(allocator, level, 0, h);
        }
        if (couldBeFull)
        {
            for (uint i = 0; i < branchingPerInnerLevel; i++)
            {
                if (children[i] != CharSetFull::TheFullNode)
                    return this;
            }
            FreeSelf(allocator);
            return CharSetFull::TheFullNode;
        }
        else
            return this;
    }